

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

shared_ptr<duckdb::ArrayColumnData,_true> __thiscall
duckdb::SharedConstructor::
Create<duckdb::ArrayColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
          (SharedConstructor *this,BlockManager *args,DataTableInfo *args_1,unsigned_long *args_2,
          unsigned_long *args_3,LogicalType *args_4,optional_ptr<duckdb::ColumnData,_true> *args_5)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<duckdb::ArrayColumnData,_true> sVar2;
  undefined1 local_21;
  ArrayColumnData *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (ArrayColumnData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrayColumnData,std::allocator<duckdb::ArrayColumnData>,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
            (&local_18,&local_20,(allocator<duckdb::ArrayColumnData> *)&local_21,args,args_1,args_2,
             args_3,args_4,args_5);
  *(ArrayColumnData **)this = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_18._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.internal.super___shared_ptr<duckdb::ArrayColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var1._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ArrayColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ArrayColumnData,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ArrayColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<T> Create(ARGS &&...args) {
		return make_shared_ptr<T>(std::forward<ARGS>(args)...);
	}